

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderMoveToFirstAttribute(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  
  iVar2 = -1;
  if ((((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
      (iVar2 = 0, pxVar1->type == XML_ELEMENT_NODE)) &&
     ((pxVar3 = (xmlNodePtr)pxVar1->nsDef, pxVar3 != (xmlNodePtr)0x0 ||
      (pxVar3 = (xmlNodePtr)pxVar1->properties, pxVar3 != (xmlNodePtr)0x0)))) {
    reader->curnode = pxVar3;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
xmlTextReaderMoveToFirstAttribute(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);

    if (reader->node->nsDef != NULL) {
	reader->curnode = (xmlNodePtr) reader->node->nsDef;
	return(1);
    }
    if (reader->node->properties != NULL) {
	reader->curnode = (xmlNodePtr) reader->node->properties;
	return(1);
    }
    return(0);
}